

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::LatticeImpl::LatticeImpl(LatticeImpl *this,Writer *writer)

{
  vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *pvVar1;
  Allocator<mecab_node_t,_mecab_path_t> *p;
  Allocator<mecab_node_t,_mecab_path_t> *in_RSI;
  vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *in_RDI;
  pointer *__n;
  
  Lattice::Lattice((Lattice *)in_RDI);
  (in_RDI->super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_clear_00247b10;
  (in_RDI->super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[1].super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fe8000000000000;
  in_RDI[1].super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 1;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::vector
            ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)0x19fcfa);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::vector
            ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)0x19fd0d);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x19fd20);
  __n = &in_RDI[6].super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19fd36);
  in_RDI[7].super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_RSI;
  scoped_ptr<MeCab::StringBuffer>::scoped_ptr
            ((scoped_ptr<MeCab::StringBuffer> *)
             &in_RDI[7].super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(StringBuffer *)0x0);
  pvVar1 = in_RDI + 8;
  p = (Allocator<mecab_node_t,_mecab_path_t> *)operator_new(0x78);
  Allocator<mecab_node_t,_mecab_path_t>::Allocator(in_RSI);
  scoped_ptr<MeCab::Allocator<mecab_node_t,_mecab_path_t>_>::scoped_ptr
            ((scoped_ptr<MeCab::Allocator<mecab_node_t,_mecab_path_t>_> *)
             &(pvVar1->super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>)._M_impl.
              super__Vector_impl_data._M_finish,p);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::reserve(in_RDI,(size_type)__n);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::reserve(in_RDI,(size_type)__n);
  return;
}

Assistant:

LatticeImpl::LatticeImpl(const Writer *writer)
    : sentence_(0), size_(0), theta_(kDefaultTheta), Z_(0.0),
      request_type_(MECAB_ONE_BEST),
      writer_(writer),
      ostrs_(0),
      allocator_(new Allocator<Node, Path>) {
  begin_nodes_.reserve(MIN_INPUT_BUFFER_SIZE);
  end_nodes_.reserve(MIN_INPUT_BUFFER_SIZE);
}